

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O3

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrCompositionLayerDepthInfoKHR *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrStructureType XVar3;
  pointer pcVar4;
  PFN_xrStructureTypeToString p_Var5;
  void *value_00;
  XrStructureType __val;
  uint uVar6;
  bool bVar7;
  char *pcVar8;
  XrInstance pXVar9;
  invalid_argument *piVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint __len;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  string next_prefix;
  string type_prefix;
  string subimage_prefix;
  string farz_prefix;
  string nearz_prefix;
  string maxdepth_prefix;
  string mindepth_prefix;
  ostringstream oss_minDepth;
  ostringstream oss_maxDepth;
  ostringstream oss_farZ;
  ostringstream oss_nearZ;
  long *local_778;
  long local_770;
  long local_768 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  long *local_738;
  long local_730;
  long local_728 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  undefined1 local_698 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_688;
  string local_678;
  string local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  PFN_xrEnumerateViewConfigurations local_5f8;
  PFN_xrGetViewConfigurationProperties p_Stack_5f0;
  PFN_xrEnumerateViewConfigurationViews local_5e8;
  PFN_xrEnumerateSwapchainFormats p_Stack_5e0;
  ios_base local_5a8 [272];
  undefined1 local_498 [112];
  ios_base local_428 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [3];
  ios_base local_2b0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  paVar1 = &local_618.field_2;
  local_618._M_dataplus._M_p = (pointer)paVar1;
  local_498._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_618,'\x12');
  *local_618._M_dataplus._M_p = '0';
  local_618._M_dataplus._M_p[1] = 'x';
  pcVar8 = local_618._M_dataplus._M_p + local_618._M_string_length + -1;
  lVar12 = 0;
  do {
    bVar2 = local_498[lVar12];
    *pcVar8 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar8[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar12 = lVar12 + 1;
    pcVar8 = pcVar8 + -2;
  } while (lVar12 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar1) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_758,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_758);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar3 = value->type;
    __val = -XVar3;
    if (0 < (int)XVar3) {
      __val = XVar3;
    }
    __len = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar13 = (ulong)__val;
      uVar6 = 4;
      do {
        __len = uVar6;
        uVar11 = (uint)uVar13;
        if (uVar11 < 100) {
          __len = __len - 2;
          goto LAB_0015decb;
        }
        if (uVar11 < 1000) {
          __len = __len - 1;
          goto LAB_0015decb;
        }
        if (uVar11 < 10000) goto LAB_0015decb;
        uVar13 = uVar13 / 10000;
        uVar6 = __len + 4;
      } while (99999 < uVar11);
      __len = __len + 1;
    }
LAB_0015decb:
    local_618._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_618,(char)__len - (char)((int)XVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_618._M_dataplus._M_p + (XVar3 >> 0x1f),__len,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_758,&local_618);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._M_dataplus._M_p != &local_618.field_2) {
      operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_5e8 = (PFN_xrEnumerateViewConfigurationViews)0x0;
    p_Stack_5e0 = (PFN_xrEnumerateSwapchainFormats)0x0;
    local_5f8 = (PFN_xrEnumerateViewConfigurations)0x0;
    p_Stack_5f0 = (PFN_xrGetViewConfigurationProperties)0x0;
    local_618.field_2._M_allocated_capacity = 0;
    local_618.field_2._8_8_ = 0;
    local_618._M_dataplus._M_p = (pointer)0x0;
    local_618._M_string_length = 0;
    p_Var5 = gen_dispatch_table->StructureTypeToString;
    pXVar9 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var5)(pXVar9,value->type,(char *)&local_618);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_758,(char (*) [64])&local_618);
  }
  local_778 = local_768;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_778,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_778);
  value_00 = value->next;
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_658,local_778,local_770 + (long)local_778);
  bVar7 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_658,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  if (!bVar7) {
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar10,"Invalid Operation");
    __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_738 = local_728;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_738,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_738);
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_678,local_738,local_730 + (long)local_738);
  gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_698;
  local_698._0_8_ = local_698 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)gen_dispatch_table_00,"XrSwapchainSubImage","");
  bVar7 = ApiDumpOutputXrStruct
                    (gen_dispatch_table_00,&value->subImage,&local_678,(string *)local_698,false,
                     contents);
  if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
    operator_delete((void *)local_698._0_8_,(ulong)(local_688._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
  }
  if (bVar7) {
    pcVar4 = (prefix->_M_dataplus)._M_p;
    local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6b8,pcVar4,pcVar4 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_6b8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_618);
    *(undefined8 *)
     ((long)&local_618._M_string_length + *(long *)(local_618._M_dataplus._M_p + -0x18)) = 0x20;
    std::ostream::_M_insert<double>((double)value->minDepth);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])"float",&local_6b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498);
    if ((XrCompositionLayerDepthInfoKHR *)local_498._0_8_ !=
        (XrCompositionLayerDepthInfoKHR *)(local_498 + 0x10)) {
      operator_delete((void *)local_498._0_8_,(ulong)(local_498._16_8_ + 1));
    }
    pcVar4 = (prefix->_M_dataplus)._M_p;
    local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6d8,pcVar4,pcVar4 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_6d8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
    *(undefined8 *)(local_498 + *(long *)(local_498._0_8_ + -0x18) + 8) = 0x20;
    std::ostream::_M_insert<double>((double)value->maxDepth);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])"float",&local_6d8,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,
                      (ulong)(local_1a8[0].field_2._M_allocated_capacity + 1));
    }
    pcVar4 = (prefix->_M_dataplus)._M_p;
    local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6f8,pcVar4,pcVar4 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_6f8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    *(undefined8 *)
     ((long)&local_1a8[0]._M_string_length + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18)) =
         0x20;
    std::ostream::_M_insert<double>((double)value->nearZ);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])"float",&local_6f8,local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
      operator_delete(local_320[0]._M_dataplus._M_p,
                      (ulong)(local_320[0].field_2._M_allocated_capacity + 1));
    }
    pcVar4 = (prefix->_M_dataplus)._M_p;
    local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_718,pcVar4,pcVar4 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_718);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    *(undefined8 *)
     ((long)&local_320[0]._M_string_length + *(long *)(local_320[0]._M_dataplus._M_p + -0x18)) =
         0x20;
    std::ostream::_M_insert<double>((double)value->farZ);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])"float",&local_718,&local_638);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._M_dataplus._M_p != &local_638.field_2) {
      operator_delete(local_638._M_dataplus._M_p,
                      (ulong)(local_638.field_2._M_allocated_capacity + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_718._M_dataplus._M_p != &local_718.field_2) {
      operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
      operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
    std::ios_base::~ios_base(local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
      operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_618);
    std::ios_base::~ios_base(local_5a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
    }
    if (local_738 != local_728) {
      operator_delete(local_738,local_728[0] + 1);
    }
    if (local_778 != local_768) {
      operator_delete(local_778,local_768[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_758._M_dataplus._M_p != &local_758.field_2) {
      operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar10,"Invalid Operation");
  __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrCompositionLayerDepthInfoKHR* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string subimage_prefix = prefix;
        subimage_prefix += "subImage";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->subImage, subimage_prefix, "XrSwapchainSubImage", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string mindepth_prefix = prefix;
        mindepth_prefix += "minDepth";
        std::ostringstream oss_minDepth;
        oss_minDepth << std::setprecision(32) << (value->minDepth);
        contents.emplace_back("float", mindepth_prefix, oss_minDepth.str());
        std::string maxdepth_prefix = prefix;
        maxdepth_prefix += "maxDepth";
        std::ostringstream oss_maxDepth;
        oss_maxDepth << std::setprecision(32) << (value->maxDepth);
        contents.emplace_back("float", maxdepth_prefix, oss_maxDepth.str());
        std::string nearz_prefix = prefix;
        nearz_prefix += "nearZ";
        std::ostringstream oss_nearZ;
        oss_nearZ << std::setprecision(32) << (value->nearZ);
        contents.emplace_back("float", nearz_prefix, oss_nearZ.str());
        std::string farz_prefix = prefix;
        farz_prefix += "farZ";
        std::ostringstream oss_farZ;
        oss_farZ << std::setprecision(32) << (value->farZ);
        contents.emplace_back("float", farz_prefix, oss_farZ.str());
        return true;
    } catch(...) {
    }
    return false;
}